

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphAdjacencyList.h
# Opt level: O1

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<cmGraphEdge*,std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (int *__result,int *__a,int *__b,int *__c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  cmGraphEdge __tmp;
  undefined8 uVar4;
  
  iVar1 = *__a;
  iVar2 = *__b;
  iVar3 = *__c;
  if (iVar1 < iVar2) {
    if (iVar2 < iVar3) {
      uVar4 = *(undefined8 *)__result;
      *(char *)(__result + 1) = (char)__b[1];
      *__result = *__b;
      *__b = (int)uVar4;
      *(char *)(__b + 1) = (char)((ulong)uVar4 >> 0x20);
      return;
    }
    uVar4 = *(undefined8 *)__result;
    if (iVar3 <= iVar1) {
      *(char *)(__result + 1) = (char)__a[1];
      *__result = *__a;
      *(char *)(__a + 1) = (char)((ulong)uVar4 >> 0x20);
      *__a = (int)uVar4;
      return;
    }
  }
  else {
    if (iVar1 < iVar3) {
      uVar4 = *(undefined8 *)__result;
      *(char *)(__result + 1) = (char)__a[1];
      *__result = *__a;
      *__a = (int)uVar4;
      *(char *)(__a + 1) = (char)((ulong)uVar4 >> 0x20);
      return;
    }
    uVar4 = *(undefined8 *)__result;
    if (iVar3 <= iVar2) {
      *(char *)(__result + 1) = (char)__b[1];
      *__result = *__b;
      *(char *)(__b + 1) = (char)((ulong)uVar4 >> 0x20);
      *__b = (int)uVar4;
      return;
    }
  }
  *(char *)(__result + 1) = (char)__c[1];
  *__result = *__c;
  *(char *)(__c + 1) = (char)((ulong)uVar4 >> 0x20);
  *__c = (int)uVar4;
  return;
}

Assistant:

operator int() const { return this->Dest; }